

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O0

int onigenc_mb4_is_code_ctype(OnigEncoding enc,OnigCodePoint code,uint ctype)

{
  int iVar1;
  uint ctype_local;
  OnigCodePoint code_local;
  OnigEncoding enc_local;
  
  if (code < 0x80) {
    if (ctype < 0xf) {
      return (uint)(((uint)OnigEncAsciiCtypeTable[code] & 1 << ((byte)ctype & 0x1f)) != 0);
    }
  }
  else if (((ctype == 0xc) || (ctype == 5)) || (ctype == 7)) {
    iVar1 = (*enc->code_to_mbclen)(code);
    return (uint)(1 < iVar1);
  }
  return 0;
}

Assistant:

extern int
onigenc_mb4_is_code_ctype(OnigEncoding enc, OnigCodePoint code,
                          unsigned int ctype)
{
  if (code < 128) {
    if (ctype <= ONIGENC_MAX_STD_CTYPE)
      return ONIGENC_IS_ASCII_CODE_CTYPE(code, ctype);
  }
  else {
    if (CTYPE_IS_WORD_GRAPH_PRINT(ctype)) {
      return (ONIGENC_CODE_TO_MBCLEN(enc, code) > 1 ? TRUE : FALSE);
    }
  }

  return FALSE;
}